

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

bool __thiscall Highs::infeasibleBoundsOk(Highs *this)

{
  double *pdVar1;
  double dVar2;
  pointer pHVar3;
  pointer pHVar4;
  string type;
  string type_00;
  ulong uVar5;
  long lVar6;
  HighsInt num_true_infeasible_bound;
  HighsInt num_ok_infeasible_bound;
  anon_class_32_4_0faf6aa2 assessInfeasibleBound;
  undefined8 in_stack_ffffffffffffff58;
  int iVar7;
  int iVar8;
  HighsLogOptions *log_options_;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 *puVar9;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  anon_class_32_4_0faf6aa2 local_50;
  
  log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
  local_50.num_true_infeasible_bound = (HighsInt *)&stack0xffffffffffffff60;
  iVar7 = 0;
  local_50.num_ok_infeasible_bound = (HighsInt *)&stack0xffffffffffffff64;
  iVar8 = 0;
  pHVar3 = (this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar4 = (this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_50.this = this;
  local_50.log_options = log_options_;
  if (0 < (this->model_).lp_.num_col_) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if ((pHVar4 == pHVar3) ||
         (((this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start[uVar5] & ~kInteger) != kSemiContinuous)) {
        dVar2 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar5];
        pdVar1 = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar5;
        if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Column","");
          type._M_string_length._0_4_ = iVar7;
          type._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58;
          type._M_string_length._4_4_ = iVar8;
          type.field_2._M_allocated_capacity = (size_type)log_options_;
          type.field_2._8_8_ = in_stack_ffffffffffffff70;
          infeasibleBoundsOk::anon_class_32_4_0faf6aa2::operator()
                    (&local_50,type,(HighsInt)local_70[0],(double *)(uVar5 & 0xffffffff),
                     (double *)
                     ((long)(this->model_).lp_.col_lower_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar6));
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 8;
    } while ((long)uVar5 < (long)(this->model_).lp_.num_col_);
  }
  if (0 < (this->model_).lp_.num_row_) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      dVar2 = *(double *)
               ((long)(this->model_).lp_.row_lower_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6);
      pdVar1 = (double *)
               ((long)(this->model_).lp_.row_upper_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6);
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        puVar9 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff70,"Row","")
        ;
        type_00._M_string_length._0_4_ = iVar7;
        type_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58;
        type_00._M_string_length._4_4_ = iVar8;
        type_00.field_2._M_allocated_capacity = (size_type)log_options_;
        type_00.field_2._8_8_ = puVar9;
        infeasibleBoundsOk::anon_class_32_4_0faf6aa2::operator()
                  (&local_50,type_00,(HighsInt)puVar9,(double *)(uVar5 & 0xffffffff),
                   (double *)
                   ((long)(this->model_).lp_.row_lower_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar6));
        if (puVar9 != local_80) {
          operator_delete(puVar9);
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 8;
    } while ((long)uVar5 < (long)(this->model_).lp_.num_row_);
  }
  if (0 < iVar8) {
    highsLogUser(log_options_,kInfo,"Model has %d small inconsistent bound(s): rectified\n");
  }
  if (0 < iVar7) {
    highsLogUser(log_options_,kInfo,"Model has %d significant inconsistent bound(s): infeasible\n");
  }
  return iVar7 == 0;
}

Assistant:

bool Highs::infeasibleBoundsOk() {
  const HighsLogOptions& log_options = this->options_.log_options;
  HighsLp& lp = this->model_.lp_;

  HighsInt num_true_infeasible_bound = 0;
  HighsInt num_ok_infeasible_bound = 0;
  const bool has_integrality = lp.integrality_.size() > 0;
  // Lambda for assessing infeasible bounds
  auto assessInfeasibleBound = [&](const std::string type, const HighsInt iX,
                                   double& lower, double& upper) {
    double range = upper - lower;
    if (range >= 0) return true;
    if (range > -this->options_.primal_feasibility_tolerance) {
      num_ok_infeasible_bound++;
      bool report = num_ok_infeasible_bound <= 10;
      bool integer_lower = lower == std::floor(lower + 0.5);
      bool integer_upper = upper == std::floor(upper + 0.5);
      assert(!integer_lower || !integer_upper);
      if (integer_lower) {
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "upper bound to %g\n",
                       type.c_str(), int(iX), lower, upper, range, lower);
        upper = lower;
      } else if (integer_upper) {
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "lower bound to %g\n",
                       type.c_str(), int(iX), lower, upper, range, upper);
        lower = upper;
      } else {
        double mid = 0.5 * (lower + upper);
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "both bounds to %g\n",
                       type.c_str(), int(iX), lower, upper, range, mid);
        lower = mid;
        upper = mid;
      }
      return true;
    }
    num_true_infeasible_bound++;
    if (num_true_infeasible_bound <= 10)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "%s %d bounds [%g, %g] have excessive infeasibility = %g\n",
                   type.c_str(), int(iX), lower, upper, range);
    return false;
  };

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (has_integrality) {
      // Semi-variables can have inconsistent bounds
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
          lp.integrality_[iCol] == HighsVarType::kSemiInteger)
        continue;
    }
    if (lp.col_lower_[iCol] > lp.col_upper_[iCol])
      assessInfeasibleBound("Column", iCol, lp.col_lower_[iCol],
                            lp.col_upper_[iCol]);
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lp.row_lower_[iRow] > lp.row_upper_[iRow])
      assessInfeasibleBound("Row", iRow, lp.row_lower_[iRow],
                            lp.row_upper_[iRow]);
  }
  if (num_ok_infeasible_bound > 0)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Model has %d small inconsistent bound(s): rectified\n",
                 int(num_ok_infeasible_bound));
  if (num_true_infeasible_bound > 0)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Model has %d significant inconsistent bound(s): infeasible\n",
                 int(num_true_infeasible_bound));
  return num_true_infeasible_bound == 0;
}